

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_text.c
# Opt level: O3

void canvas_objfor(_glist *gl,t_text *x,int argc,t_atom *argv)

{
  _binbuf *p_Var1;
  t_float tVar2;
  
  x->te_width = 0;
  x->field_0x2e = (x->field_0x2e & 0xfc) + 1;
  p_Var1 = binbuf_new();
  x->te_binbuf = p_Var1;
  tVar2 = atom_getfloatarg(0,argc,argv);
  x->te_xpix = (short)(int)tVar2;
  tVar2 = atom_getfloatarg(1,argc,argv);
  x->te_ypix = (short)(int)tVar2;
  if (2 < argc) {
    binbuf_restore(x->te_binbuf,argc + -2,argv + 2);
  }
  glist_add(gl,&x->te_g);
  return;
}

Assistant:

void canvas_objfor(t_glist *gl, t_text *x, int argc, t_atom *argv)
{
    x->te_width = 0;                            /* don't know it yet. */
    x->te_type = T_OBJECT;
    x->te_binbuf = binbuf_new();
    x->te_xpix = atom_getfloatarg(0, argc, argv);
    x->te_ypix = atom_getfloatarg(1, argc, argv);
    if (argc > 2) binbuf_restore(x->te_binbuf, argc-2, argv+2);
    glist_add(gl, &x->te_g);
}